

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O3

void __thiscall icu_63::number::impl::SimpleModifier::SimpleModifier(SimpleModifier *this)

{
  (this->super_Modifier)._vptr_Modifier = (_func_int **)&PTR__SimpleModifier_003d7590;
  (this->fCompiledPattern).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e4fd8;
  (this->fCompiledPattern).fUnion.fStackFields.fLengthAndFlags = 2;
  this->fField = UNUM_FIELD_COUNT;
  this->fStrong = false;
  this->fPrefixLength = 0;
  this->fSuffixOffset = -1;
  this->fSuffixLength = 0;
  (this->fParameters).obj = (ModifierStore *)0x0;
  return;
}

Assistant:

SimpleModifier::SimpleModifier()
        : fField(UNUM_FIELD_COUNT), fStrong(false), fPrefixLength(0), fSuffixLength(0) {
}